

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void __thiscall CVmObjGramProd::apply_undo(CVmObjGramProd *this,CVmUndoRecord *undo_rec)

{
  vm_obj_id_t self;
  int iVar1;
  int *piVar2;
  size_t idx;
  
  piVar2 = (int *)(undo_rec->id).ptrval;
  if (piVar2 != (int *)0x0) {
    self = undo_rec->obj;
    idx = (size_t)*piVar2;
    iVar1 = piVar2[1];
    if (iVar1 == 3) {
      delete_alt(this,idx);
      check_circular_refs(this,self);
      return;
    }
    if (iVar1 == 2) {
      *(vmgram_alt_info **)(*(long *)((this->super_CVmObject).ext_ + 0x30) + idx * 8) =
           *(vmgram_alt_info **)(piVar2 + 2);
    }
    else if (iVar1 == 1) {
      insert_alt(this,self,idx,*(vmgram_alt_info **)(piVar2 + 2));
      piVar2[2] = 0;
      piVar2[3] = 0;
    }
  }
  return;
}

Assistant:

void CVmObjGramProd::apply_undo(VMG_ CVmUndoRecord *undo_rec)
{
    /* we only store pointer records, so ignore other types */
    if (undo_rec->id.ptrval != 0)
    {
        /* get our private undo record, properly cast */
        vmgram_undo_rec *rec = (vmgram_undo_rec *)undo_rec->id.ptrval;

        /* get the 'self' object from the undo record */
        vm_obj_id_t self = undo_rec->obj;

        /* get the original alternative object and its original index */
        vmgram_alt_info *alt = rec->alt;
        int idx = rec->idx;

        /* get our alternative list and count */
        vmgram_alt_info **alts = get_ext()->alts_;
        
        /* apply undo based on the event type */
        switch (rec->op)
        {
        case VMGRAM_UNDO_DELETED:
            /* deleted a record - re-insert it at the original index */
            insert_alt(self, idx, alt);

            /* the grammar prod object owns it now - clear it in the undo */
            rec->alt = 0;
            break;

        case VMGRAM_UNDO_REPLACED:
            /* replaced a record - restore it at the original index */
            alts[idx] = alt;
            break;

        case VMGRAM_UNDO_ADDED:
            /* added a new record - delete the record at this index */
            delete_alt(idx);

            /* check for circular references */
            check_circular_refs(self);
            break;
        }
    }
}